

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall thread_pool::worker(thread_pool *this)

{
  bool bVar1;
  reference __x;
  undefined1 local_70 [8];
  unique_lock<std::mutex> lock_1;
  exception *e;
  undefined1 local_40 [8];
  unique_lock<std::mutex> lock;
  function<void_()> func;
  thread_pool *this_local;
  
  while (bVar1 = std::atomic::operator_cast_to_bool((atomic *)this), bVar1) {
    std::function<void_()>::function((function<void_()> *)&lock._M_owns);
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_40,&this->m_mutex);
    std::condition_variable::wait<thread_pool::worker()::_lambda()_1_>
              (&this->m_cv,(unique_lock<std::mutex> *)local_40,(anon_class_8_1_8991fb9c)this);
    bVar1 = std::
            queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
            ::empty(&this->m_work);
    if (!bVar1) {
      __x = std::
            queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
            ::front(&this->m_work);
      std::function<void_()>::operator=((function<void_()> *)&lock._M_owns,__x);
      this->m_doingWork = this->m_doingWork + 1;
      std::
      queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
      ::pop(&this->m_work);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    bVar1 = std::function::operator_cast_to_bool((function *)&lock._M_owns);
    if (bVar1) {
      std::function<void_()>::operator()((function<void_()> *)&lock._M_owns);
    }
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_70,&this->m_mutex);
    this->m_doingWork = this->m_doingWork + -1;
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_70);
    std::function<void_()>::~function((function<void_()> *)&lock._M_owns);
  }
  return;
}

Assistant:

void worker() {
    while (m_running) {
      std::function<void()> func;
      {
        std::unique_lock<std::mutex> lock(m_mutex);
        m_cv.wait(lock, [this]() -> bool {
                          return !m_running || !m_work.empty();
                        });
        if (!m_work.empty()) {
          func = std::move(m_work.front());
          ++m_doingWork;
          m_work.pop();
        }
      }
      try {
        if (func)
          func();
      }
      // TODO handle exceptions in a better way
      catch (const std::exception& e) {
        assert(false);
      }
      catch (...) {
        assert(false);
      }

      {
        std::unique_lock<std::mutex> lock(m_mutex);
        --m_doingWork;
        m_cvWait.notify_all();
      }
    }
  }